

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_handler.cpp
# Opt level: O1

bool __thiscall spvtools::AssemblyContext::isStartOfNewInst(AssemblyContext *this)

{
  spv_text psVar1;
  char *pcVar2;
  spv_result_t sVar3;
  int iVar4;
  bool bVar5;
  spv_position_t pos;
  string word;
  spv_position_t local_58;
  string local_40;
  
  local_58.index = (this->current_position_).index;
  local_58.line = (this->current_position_).line;
  local_58.column = (this->current_position_).column;
  psVar1 = this->text_;
  sVar3 = anon_unknown_6::advance(psVar1,&local_58);
  if (sVar3 != SPV_SUCCESS) {
    return false;
  }
  if ((((local_58.index + 3 <= psVar1->length) &&
       (pcVar2 = psVar1->str, pcVar2[local_58.index] == 'O')) && (pcVar2[local_58.index + 1] == 'p')
      ) && ((byte)(pcVar2[local_58.index + 2] + 0xbfU) < 0x1a)) {
    return true;
  }
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  local_58.line = (this->current_position_).line;
  local_58.column = (this->current_position_).column;
  local_58.index = (this->current_position_).index;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  sVar3 = anon_unknown_6::getWord(psVar1,&local_58,&local_40);
  if ((sVar3 == SPV_SUCCESS) && (*local_40._M_dataplus._M_p == '%')) {
    psVar1 = this->text_;
    sVar3 = anon_unknown_6::advance(psVar1,&local_58);
    if ((sVar3 == SPV_SUCCESS) &&
       ((sVar3 = anon_unknown_6::getWord(psVar1,&local_58,&local_40), sVar3 == SPV_SUCCESS &&
        (iVar4 = std::__cxx11::string::compare((char *)&local_40), iVar4 == 0)))) {
      psVar1 = this->text_;
      sVar3 = anon_unknown_6::advance(psVar1,&local_58);
      if ((sVar3 == SPV_SUCCESS) && (local_58.index + 3 <= psVar1->length)) {
        pcVar2 = psVar1->str;
        bVar5 = false;
        if ((pcVar2[local_58.index] == 'O') && (bVar5 = false, pcVar2[local_58.index + 1] == 'p')) {
          bVar5 = (byte)(pcVar2[local_58.index + 2] + 0xbfU) < 0x1a;
        }
        goto LAB_001867c0;
      }
    }
  }
  bVar5 = false;
LAB_001867c0:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,
                    CONCAT71(local_40.field_2._M_allocated_capacity._1_7_,
                             local_40.field_2._M_local_buf[0]) + 1);
  }
  return bVar5;
}

Assistant:

bool AssemblyContext::isStartOfNewInst() {
  spv_position_t pos = current_position_;
  if (spvtools::advance(text_, &pos)) return false;
  if (spvtools::startsWithOp(text_, &pos)) return true;

  std::string word;
  pos = current_position_;
  if (spvtools::getWord(text_, &pos, &word)) return false;
  if ('%' != word.front()) return false;

  if (spvtools::advance(text_, &pos)) return false;
  if (spvtools::getWord(text_, &pos, &word)) return false;
  if ("=" != word) return false;

  if (spvtools::advance(text_, &pos)) return false;
  if (spvtools::startsWithOp(text_, &pos)) return true;
  return false;
}